

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_model.c
# Opt level: O2

void PrintSolution_C(CAPIExample *pex,char *stub)

{
  int i;
  long lVar1;
  
  printf("\n     ********** SOLUTION (%s.sol) ***********\n");
  puts("DUALS.");
  for (lVar1 = 0; lVar1 < pex->n_con; lVar1 = lVar1 + 1) {
    printf("   %10s = %.17g\n",pex->sol_dual_[lVar1],pex->con_name[lVar1]);
  }
  puts("PRIMALS.");
  for (lVar1 = 0; lVar1 < pex->n_con; lVar1 = lVar1 + 1) {
    printf("      %7s = %.17g\n",pex->sol_primal_[lVar1],pex->var_name[lVar1]);
  }
  printf("\nObjno used: %d, solve_result_num: %d\n",(ulong)(pex->objno_ + 1),
         (ulong)(uint)pex->solve_code_);
  return;
}

Assistant:

void PrintSolution_C(CAPIExample* pex, const char* stub) {
  printf(
        "\n     ********** SOLUTION (%s.sol) ***********\n",
        stub);
  printf("%s\n", "DUALS.");
  for (int i=0; i<pex->n_con; ++i)
    printf("   %10s = %.17g\n",
           pex->con_name[i], pex->sol_dual_[i]);
  printf("%s\n", "PRIMALS.");
  for (int i=0; i<pex->n_con; ++i)
    printf("      %7s = %.17g\n",
           pex->var_name[i], pex->sol_primal_[i]);

  printf("\nObjno used: %d, solve_result_num: %d\n",
         pex->objno_+1, pex->solve_code_);
}